

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.cpp
# Opt level: O1

bool xercesc_4_0::XMLString::isWSReplaced(XMLCh *toCheck)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((toCheck != (XMLCh *)0x0) && (*toCheck != L'\0')) {
    XVar1 = *toCheck;
    bVar3 = XVar1 == L'\0';
    if (!bVar3) {
      pXVar2 = toCheck + 1;
      do {
        if (((ushort)XVar1 < 0xe) && ((0x2600U >> ((ushort)XVar1 & 0x1f) & 1) != 0)) {
          return false;
        }
        XVar1 = *pXVar2;
        pXVar2 = pXVar2 + 1;
        bVar3 = XVar1 == L'\0';
      } while (!bVar3);
    }
  }
  return bVar3;
}

Assistant:

bool XMLString::isWSReplaced(const XMLCh* const toCheck)
{
    // If no string, then its a OK
    if (( !toCheck ) || ( !*toCheck ))
        return true;

    const XMLCh* startPtr = toCheck;
    while ( *startPtr )
    {
        if ( ( *startPtr == chCR) ||
             ( *startPtr == chLF) ||
             ( *startPtr == chHTab))
        return false;

        startPtr++;
    }

    return true;
}